

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O3

void set_event_xy(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  send_motion = (Fl_Window *)0x0;
  Fl::e_x_root = (fl_xevent->xkey).x_root;
  Fl::e_x = (fl_xevent->xkey).x;
  Fl::e_y_root = (fl_xevent->xkey).y_root;
  Fl::e_y = (fl_xevent->xkey).y;
  Fl::e_state = (fl_xevent->xkey).state << 0x10;
  fl_event_time = (fl_xevent->xkey).time;
  iVar2 = (fl_xevent->xkey).x_root - px;
  iVar1 = -iVar2;
  if (0 < iVar2) {
    iVar1 = iVar2;
  }
  iVar3 = (fl_xevent->xkey).y_root - py;
  iVar2 = -iVar3;
  if (0 < iVar3) {
    iVar2 = iVar3;
  }
  if ((3 < (uint)(iVar2 + iVar1)) || (ptime + 1000 <= (fl_xevent->xkey).time)) {
    Fl::e_is_click = 0;
  }
  return;
}

Assistant:

static void set_event_xy() {
#  if CONSOLIDATE_MOTION
  send_motion = 0;
#  endif
  Fl::e_x_root  = fl_xevent->xbutton.x_root;
  Fl::e_x       = fl_xevent->xbutton.x;
  Fl::e_y_root  = fl_xevent->xbutton.y_root;
  Fl::e_y       = fl_xevent->xbutton.y;
  Fl::e_state   = fl_xevent->xbutton.state << 16;
  fl_event_time = fl_xevent->xbutton.time;
#  ifdef __sgi
  // get the meta key off PC keyboards:
  if (fl_key_vector[18]&0x18) Fl::e_state |= FL_META;
#  endif
  // turn off is_click if enough time or mouse movement has passed:
  if (abs(Fl::e_x_root-px)+abs(Fl::e_y_root-py) > 3 ||
      fl_event_time >= ptime+1000)
    Fl::e_is_click = 0;
}